

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  int iVar1;
  NodeType NVar2;
  ShaderType SVar3;
  Node *pNVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  ResourceTestCase *pRVar7;
  SharedPtrStateBase *pSVar8;
  deInt32 *pdVar9;
  SharedPtr variable;
  SharedPtr variable_1;
  SharedPtr layout;
  SharedPtr variable_2;
  undefined1 local_a0 [8];
  SharedPtrStateBase *pSStack_98;
  MatrixOrder local_90;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  TestNode *local_58;
  Context *local_50;
  Node *local_48;
  SharedPtrStateBase *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar5 = parentStructure->m_ptr;
  NVar2 = pNVar5->m_type;
  local_58 = &targetGroup->super_TestNode;
  local_50 = context;
  if (NVar2 == TYPE_DEFAULT_BLOCK) {
    pNVar4 = (Node *)operator_new(0x28);
    pSVar8 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    if (pSVar8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34bd8;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0;
    local_48 = pNVar4;
    local_40 = (SharedPtrStateBase *)operator_new(0x20);
    local_40->strongRefCount = 0;
    local_40->weakRefCount = 0;
    local_40->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_40[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    local_40->strongRefCount = 1;
    local_40->weakRefCount = 1;
  }
  else {
    local_40 = parentStructure->m_state;
    local_48 = pNVar5;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_40->weakRefCount = local_40->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar3 = getShaderMaskFirstStage(presentShadersMask);
  if (SVar3 == SHADERTYPE_FRAGMENT) {
LAB_0053ac8d:
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_78,
               "var");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = pSStack_98;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_78.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_88,
               "var_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = pSStack_98;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_78.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_struct");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_78.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_78.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x20);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_struct_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_88.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar8 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_78.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_array");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_78.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_78.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_88.m_state = pSVar8;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_array_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
LAB_0053b7d4:
    pSVar6 = local_88.m_state;
    pdVar9 = &pSVar8->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar9 = &pSVar6->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    if (pSStack_98 == (SharedPtrStateBase *)0x0) goto LAB_0053b848;
    LOCK();
    pdVar9 = &pSStack_98->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    iVar1 = *pdVar9;
    UNLOCK();
LAB_0053b819:
    pSVar8 = pSStack_98;
    if (iVar1 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    pSVar8 = pSStack_98;
    if (*pdVar9 == 0) {
LAB_0053b83d:
      if (pSVar8 != (SharedPtrStateBase *)0x0) {
        (*pSVar8->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  else {
    if (SVar3 == SHADERTYPE_VERTEX) {
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_VARIABLE;
      (pNVar5->m_enclosingNode).m_ptr = local_48;
      (pNVar5->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
      local_a0 = (undefined1  [8])pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_98 = pSVar6;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_78,
                 "var");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
      pSVar8 = pSStack_98;
      pdVar9 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
      pNVar5 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar5->m_enclosingNode).m_ptr = local_48;
      (pNVar5->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
      pNVar5[1]._vptr_Node = (_func_int **)local_a0;
      *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
      *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar8->strongRefCount = 0;
      pSVar8->weakRefCount = 0;
      pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar8->strongRefCount = 1;
      pSVar8->weakRefCount = 1;
      local_78.m_state = pSVar8;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = pNVar5;
      (pNVar4->m_enclosingNode).m_state = pSVar8;
      LOCK();
      pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
      pSStack_98 = (SharedPtrStateBase *)0x0;
      local_a0 = (undefined1  [8])pNVar4;
      pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar8->strongRefCount = 0;
      pSVar8->weakRefCount = 0;
      pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar8->strongRefCount = 1;
      pSVar8->weakRefCount = 1;
      pSStack_98 = pSVar8;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_88,
                 "var_explicit_location");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
      pdVar9 = &pSVar8->strongRefCount;
      LOCK();
      *pdVar9 = *pdVar9 + -1;
      iVar1 = *pdVar9;
      UNLOCK();
      goto LAB_0053b819;
    }
    if (NVar2 != TYPE_DEFAULT_BLOCK) goto LAB_0053ac8d;
    if ((SVar3 & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_GEOMETRY) {
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_48;
      (pNVar5->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
      local_a0 = (undefined1  [8])pNVar5;
      pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar8->strongRefCount = 0;
      pSVar8->weakRefCount = 0;
      pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar8->strongRefCount = 1;
      pSVar8->weakRefCount = 1;
      pSStack_98 = pSVar8;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = pNVar5;
      (pNVar4->m_enclosingNode).m_state = pSVar8;
      LOCK();
      pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
      local_78.m_ptr = pNVar4;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_50,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
      pSVar8 = local_78.m_state;
      pdVar9 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      pSVar8 = pSStack_98;
      if (pSStack_98 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar9 = &pSStack_98->strongRefCount;
        *pdVar9 = *pdVar9 + -1;
        UNLOCK();
        if (*pdVar9 == 0) {
          local_a0 = (undefined1  [8])0x0;
          (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
        }
        LOCK();
        pdVar9 = &pSVar8->weakRefCount;
        *pdVar9 = *pdVar9 + -1;
        UNLOCK();
        if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
          (*pSStack_98->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar5 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar5->m_enclosingNode).m_ptr = local_48;
      (pNVar5->m_enclosingNode).m_state = local_40;
      if (local_40 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_40->strongRefCount = local_40->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar9 = *pdVar9 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
      pNVar5[1]._vptr_Node = (_func_int **)local_a0;
      *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
      *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar8->strongRefCount = 0;
      pSVar8->weakRefCount = 0;
      pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar8->strongRefCount = 1;
      pSVar8->weakRefCount = 1;
      local_78.m_state = pSVar8;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar4->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar4->m_enclosingNode).m_ptr = pNVar5;
      (pNVar4->m_enclosingNode).m_state = pSVar8;
      LOCK();
      pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 0xfffffffe;
      pSStack_98 = (SharedPtrStateBase *)0x0;
      local_a0 = (undefined1  [8])pNVar4;
      pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar8->strongRefCount = 0;
      pSVar8->weakRefCount = 0;
      pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar8->strongRefCount = 1;
      pSVar8->weakRefCount = 1;
      pSStack_98 = pSVar8;
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_VARIABLE;
      (pNVar5->m_enclosingNode).m_ptr = pNVar4;
      (pNVar5->m_enclosingNode).m_state = pSVar8;
      LOCK();
      pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar5;
      pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar8->strongRefCount = 0;
      pSVar8->weakRefCount = 0;
      pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar8->strongRefCount = 1;
      pSVar8->weakRefCount = 1;
      local_88.m_state = pSVar8;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
                 "var_explicit_location");
      tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
      goto LAB_0053b7d4;
    }
    if (SVar3 != SHADERTYPE_TESSELLATION_EVALUATION) goto LAB_0053b885;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar5 = parentStructure->m_ptr;
    pSVar8 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    if (pSVar8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34bd8;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 5;
    local_78.m_ptr = pNVar4;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,"var");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_88.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_48;
    (pNVar5->m_enclosingNode).m_state = local_40;
    if (local_40 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_40->strongRefCount = local_40->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_88.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xfffffffe;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase(pRVar7,local_50,&local_68,&local_38,"var_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_68.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar8 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_88.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_88,
               "patch_var");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = pSStack_98;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_88.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_98 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,(SharedPtr *)local_a0,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = pSStack_98;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_a0 = (undefined1  [8])0x0;
      (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_98->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_88.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_struct");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_88.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_88.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x20);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_68,&local_38,"patch_var_struct_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_68.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar8 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_88.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_array");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_88.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a0,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar5[1]._vptr_Node = (_func_int **)local_a0;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_98;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_90;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    local_88.m_state = pSVar8;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    pSStack_98 = (SharedPtrStateBase *)0x0;
    local_a0 = (undefined1  [8])pNVar4;
    pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar8->strongRefCount = 0;
    pSVar8->weakRefCount = 0;
    pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar8->strongRefCount = 1;
    pSVar8->weakRefCount = 1;
    pSStack_98 = pSVar8;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_50,&local_68,&local_38,"patch_var_array_explicit_location");
    tcu::TestNode::addChild(local_58,(TestNode *)pRVar7);
    pSVar8 = local_68.m_state;
    pdVar9 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar8 = pSStack_98;
    if (pSStack_98 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSStack_98->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_a0 = (undefined1  [8])0x0;
        (*pSStack_98->_vptr_SharedPtrStateBase[2])(pSStack_98);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSStack_98 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_98->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar8 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_88.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar9 = &pSVar8->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      pSVar8 = local_88.m_state;
      if (*pdVar9 != 0) goto LAB_0053b848;
      goto LAB_0053b83d;
    }
  }
LAB_0053b848:
  pSVar8 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &(local_78.m_state)->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
LAB_0053b885:
  pSVar8 = local_40;
  if (local_40 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_40->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_48 = (Node *)0x0;
      (*local_40->_vptr_SharedPtrStateBase[2])(local_40);
    }
    LOCK();
    pdVar9 = &pSVar8->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_40 != (SharedPtrStateBase *)0x0)) {
      (*local_40->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramInputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}